

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

bool __thiscall
perfetto::protos::gen::DebugAnnotation_NestedValue::operator==
          (DebugAnnotation_NestedValue *this,DebugAnnotation_NestedValue *other)

{
  size_t __n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__first1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__last1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__first2;
  DebugAnnotation_NestedValue *pDVar1;
  bool bVar2;
  bool bVar3;
  __type_conflict4 _Var4;
  int iVar5;
  DebugAnnotation_NestedValue *pDVar6;
  DebugAnnotation_NestedValue *pDVar7;
  
  __n = (this->unknown_fields_)._M_string_length;
  if ((__n == (other->unknown_fields_)._M_string_length) &&
     (((__n == 0 ||
       (iVar5 = bcmp((this->unknown_fields_)._M_dataplus._M_p,
                     (other->unknown_fields_)._M_dataplus._M_p,__n), iVar5 == 0)) &&
      (this->nested_type_ == other->nested_type_)))) {
    __first1 = (this->dict_keys_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    __last1 = (this->dict_keys_).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    __first2 = (other->dict_keys_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if (((long)__last1 - (long)__first1 ==
         (long)(other->dict_keys_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish - (long)__first2) &&
       (bVar2 = ::std::__equal<false>::
                equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                          (__first1,__last1,__first2), bVar2)) {
      pDVar7 = (this->dict_values_).
               super__Vector_base<perfetto::protos::gen::DebugAnnotation_NestedValue,_std::allocator<perfetto::protos::gen::DebugAnnotation_NestedValue>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pDVar1 = (this->dict_values_).
               super__Vector_base<perfetto::protos::gen::DebugAnnotation_NestedValue,_std::allocator<perfetto::protos::gen::DebugAnnotation_NestedValue>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pDVar6 = (other->dict_values_).
               super__Vector_base<perfetto::protos::gen::DebugAnnotation_NestedValue,_std::allocator<perfetto::protos::gen::DebugAnnotation_NestedValue>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((long)pDVar1 - (long)pDVar7 ==
          (long)(other->dict_values_).
                super__Vector_base<perfetto::protos::gen::DebugAnnotation_NestedValue,_std::allocator<perfetto::protos::gen::DebugAnnotation_NestedValue>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar6) {
        bVar2 = pDVar7 == pDVar1;
        if (!bVar2) {
          bVar3 = operator==(pDVar7,pDVar6);
          if (bVar3) {
            do {
              pDVar7 = pDVar7 + 1;
              pDVar6 = pDVar6 + 1;
              bVar2 = pDVar7 == pDVar1;
              if (bVar2) goto LAB_002b90ec;
              bVar3 = operator==(pDVar7,pDVar6);
            } while (bVar3);
          }
          if (!bVar2) {
            return false;
          }
        }
LAB_002b90ec:
        pDVar7 = (this->array_values_).
                 super__Vector_base<perfetto::protos::gen::DebugAnnotation_NestedValue,_std::allocator<perfetto::protos::gen::DebugAnnotation_NestedValue>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pDVar1 = (this->array_values_).
                 super__Vector_base<perfetto::protos::gen::DebugAnnotation_NestedValue,_std::allocator<perfetto::protos::gen::DebugAnnotation_NestedValue>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pDVar6 = (other->array_values_).
                 super__Vector_base<perfetto::protos::gen::DebugAnnotation_NestedValue,_std::allocator<perfetto::protos::gen::DebugAnnotation_NestedValue>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((long)pDVar1 - (long)pDVar7 ==
            (long)(other->array_values_).
                  super__Vector_base<perfetto::protos::gen::DebugAnnotation_NestedValue,_std::allocator<perfetto::protos::gen::DebugAnnotation_NestedValue>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar6) {
          bVar2 = pDVar7 == pDVar1;
          if (!bVar2) {
            bVar3 = operator==(pDVar7,pDVar6);
            if (bVar3) {
              do {
                pDVar7 = pDVar7 + 1;
                pDVar6 = pDVar6 + 1;
                bVar2 = pDVar7 == pDVar1;
                if (bVar2) goto LAB_002b9159;
                bVar3 = operator==(pDVar7,pDVar6);
              } while (bVar3);
            }
            if (!bVar2) {
              return false;
            }
          }
LAB_002b9159:
          if (this->int_value_ == other->int_value_) {
            if (((this->double_value_ == other->double_value_) &&
                (!NAN(this->double_value_) && !NAN(other->double_value_))) &&
               (this->bool_value_ == other->bool_value_)) {
              _Var4 = ::std::operator==(&this->string_value_,&other->string_value_);
              return _Var4;
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

T&& value() && {
    PERFETTO_CHECK(storage_.is_populated_);
    return std::move(storage_.value_);
  }